

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.h
# Opt level: O0

void SEND(HttpResponse *res)

{
  bool bVar1;
  undefined1 local_30 [8];
  string headerStr;
  HttpResponse *res_local;
  
  headerStr.field_2._8_8_ = res;
  HttpResponse::getHeaderStr_abi_cxx11_((string *)local_30,res);
  bVar1 = HttpResponse::IsChunked((HttpResponse *)headerStr.field_2._8_8_);
  if (bVar1) {
    write_chunked(*(int *)(headerStr.field_2._8_8_ + 0x110),
                  *(char **)(headerStr.field_2._8_8_ + 0xf8),0x400,(string *)local_30);
  }
  else {
    write_static(*(int *)(headerStr.field_2._8_8_ + 0x110),
                 *(char **)(headerStr.field_2._8_8_ + 0xf8),
                 *(int *)(headerStr.field_2._8_8_ + 0x100),*(int *)(headerStr.field_2._8_8_ + 0x104)
                 ,(string *)local_30);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void SEND(HttpResponse &res)
    {
        string headerStr = res.getHeaderStr();
        if (res.IsChunked())
        {
            write_chunked(res._fd, res.filename, 1024, headerStr);
        }
        else
        {
            write_static(res._fd, res.filename, res.start_pos, res.end_pos, headerStr);
        }
    }